

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

int main(void)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float float_value;
  uint16_t value;
  mraa_aio_context aio;
  mraa_result_t status;
  
  signal(2,sig_handler);
  mraa_init();
  lVar3 = mraa_aio_init(0);
  if (lVar3 == 0) {
    fprintf(_stderr,"Failed to initialize AIO\n");
    mraa_deinit();
    aio._4_4_ = 1;
  }
  else {
    while (flag != 0) {
      uVar1 = mraa_aio_read(lVar3);
      fVar4 = (float)mraa_aio_read_float(lVar3);
      fprintf(_stdout,"ADC A0 read %X - %d\n",(ulong)uVar1,(ulong)uVar1);
      fprintf(_stdout,"ADC A0 read float - %.5f\n",(double)fVar4);
    }
    iVar2 = mraa_aio_close(lVar3);
    if (iVar2 == 0) {
      mraa_deinit();
      aio._4_4_ = 0;
    }
    else {
      mraa_result_print(iVar2);
      mraa_deinit();
      aio._4_4_ = 1;
    }
  }
  return aio._4_4_;
}

Assistant:

int
main()
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_aio_context aio;
    uint16_t value = 0;
    float float_value = 0.0;

    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize AIO */
    aio = mraa_aio_init(AIO_PORT);
    if (aio == NULL) {
        fprintf(stderr, "Failed to initialize AIO\n");
        mraa_deinit();
        return EXIT_FAILURE;
    }

    while (flag) {
        value = mraa_aio_read(aio);
        float_value = mraa_aio_read_float(aio);
        fprintf(stdout, "ADC A0 read %X - %d\n", value, value);
        fprintf(stdout, "ADC A0 read float - %.5f\n", float_value);
    }

    /* close AIO */
    status = mraa_aio_close(aio);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}